

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

string * tinyusdz::tydra::DumpRenderScene
                   (string *__return_storage_ptr__,RenderScene *scene,string *format)

{
  byte bVar1;
  _Rb_tree_color _Var2;
  pointer pSVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pUVar6;
  pointer pTVar7;
  pointer pBVar8;
  bool bVar9;
  uint uVar10;
  string *psVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long *plVar15;
  ostream *poVar16;
  pointer pAVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  _Base_ptr p_Var20;
  ostream *poVar21;
  uint32_t uVar22;
  long *plVar23;
  ulong uVar24;
  uint32_t n;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t extraout_EDX_30;
  uint32_t extraout_EDX_31;
  uint32_t extraout_EDX_32;
  uint32_t extraout_EDX_33;
  uint32_t extraout_EDX_34;
  uint32_t extraout_EDX_35;
  uint32_t extraout_EDX_36;
  uint32_t extraout_EDX_37;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t extraout_EDX_38;
  uint32_t extraout_EDX_39;
  uint32_t extraout_EDX_40;
  uint32_t extraout_EDX_41;
  uint32_t extraout_EDX_42;
  uint32_t extraout_EDX_43;
  uint32_t extraout_EDX_44;
  uint32_t extraout_EDX_45;
  uint32_t extraout_EDX_46;
  uint32_t extraout_EDX_47;
  uint32_t extraout_EDX_48;
  uint32_t extraout_EDX_49;
  uint32_t extraout_EDX_50;
  uint32_t extraout_EDX_51;
  uint32_t n_06;
  uint32_t extraout_EDX_52;
  uint32_t extraout_EDX_53;
  uint32_t extraout_EDX_54;
  uint32_t n_07;
  uint32_t n_08;
  uint32_t n_09;
  uint32_t n_10;
  uint32_t n_11;
  uint32_t n_12;
  uint32_t n_13;
  uint32_t n_14;
  uint32_t n_15;
  uint32_t n_16;
  uint32_t n_17;
  uint32_t n_18;
  uint32_t n_19;
  uint32_t extraout_EDX_55;
  uint32_t extraout_EDX_56;
  uint32_t extraout_EDX_57;
  uint32_t extraout_EDX_58;
  uint32_t n_20;
  uint32_t extraout_EDX_59;
  uint32_t extraout_EDX_60;
  uint32_t extraout_EDX_61;
  uint32_t extraout_EDX_62;
  WrapMode mode;
  uint32_t extraout_EDX_63;
  uint32_t extraout_EDX_64;
  uint32_t extraout_EDX_65;
  WrapMode mode_00;
  uint32_t extraout_EDX_66;
  uint32_t extraout_EDX_67;
  uint32_t extraout_EDX_68;
  uint32_t extraout_EDX_69;
  uint32_t extraout_EDX_70;
  uint32_t extraout_EDX_71;
  uint32_t extraout_EDX_72;
  uint32_t extraout_EDX_73;
  uint32_t extraout_EDX_74;
  uint32_t extraout_EDX_75;
  uint32_t extraout_EDX_76;
  uint32_t extraout_EDX_77;
  uint32_t extraout_EDX_78;
  uint32_t extraout_EDX_79;
  uint32_t extraout_EDX_80;
  uint32_t extraout_EDX_81;
  uint32_t extraout_EDX_82;
  uint32_t n_21;
  uint32_t n_22;
  uint32_t extraout_EDX_83;
  uint32_t extraout_EDX_84;
  uint32_t extraout_EDX_85;
  uint32_t extraout_EDX_86;
  uint32_t extraout_EDX_87;
  uint32_t extraout_EDX_88;
  uint32_t extraout_EDX_89;
  uint32_t extraout_EDX_90;
  uint32_t extraout_EDX_91;
  uint32_t extraout_EDX_92;
  uint32_t extraout_EDX_93;
  uint32_t extraout_EDX_94;
  uint32_t extraout_EDX_95;
  uint32_t extraout_EDX_96;
  ColorSpace cty;
  uint32_t extraout_EDX_97;
  uint32_t extraout_EDX_98;
  uint32_t extraout_EDX_99;
  uint32_t n_23;
  uint32_t n_24;
  uint32_t extraout_EDX_x00100;
  uint32_t extraout_EDX_x00101;
  ComponentType cty_00;
  uint32_t n_25;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  RenderMesh *mesh;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar25;
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
  *samples;
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
  *samples_00;
  _Rb_tree_node_base *p_Var26;
  char *pcVar27;
  uint uVar28;
  ulong uVar29;
  pointer pNVar30;
  ulong uVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  uint uVar33;
  RenderScene *pRVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  string __str_8;
  string __str_7;
  stringstream ss_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream ss;
  string local_5b8;
  long *local_598;
  long local_590;
  long local_588;
  long lStack_580;
  string local_578;
  ostream *local_558;
  char *local_550;
  long local_548;
  undefined2 local_540;
  undefined6 uStack_53e;
  RenderScene *local_530;
  ostream *local_528;
  undefined1 local_520 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510 [7];
  _Rb_tree_node_base a_Stack_4a0 [8];
  _Rb_tree_node_base *local_398;
  _Rb_tree_node_base *local_390;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [7];
  _Rb_tree_node_base local_308 [8];
  string *local_200;
  _Rb_tree_node_base *local_1f8;
  ostream *local_1f0;
  ulong local_1e8;
  _Base_ptr local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  iVar13 = ::std::__cxx11::string::compare((char *)format);
  if (iVar13 == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"// `json` format is not supported yet. Use KDL format\n",0x36);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"title ",6);
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"\"","");
  local_388._0_8_ = (ostream *)(local_388 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_388,local_5b8._M_dataplus._M_p,
             local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
  ::std::__cxx11::string::_M_append((char *)local_388,(ulong)(scene->usd_filename)._M_dataplus._M_p)
  ;
  plVar15 = (long *)::std::__cxx11::string::_M_append
                              ((char *)local_388,(ulong)local_5b8._M_dataplus._M_p);
  plVar23 = plVar15 + 2;
  if ((long *)*plVar15 == plVar23) {
    local_510[0]._0_8_ = *plVar23;
    local_510[0]._8_8_ = plVar15[3];
    local_520._0_8_ = local_520 + 0x10;
  }
  else {
    local_510[0]._0_8_ = *plVar23;
    local_520._0_8_ = (long *)*plVar15;
  }
  local_520._8_8_ = plVar15[1];
  *plVar15 = (long)plVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
    operator_delete((void *)local_388._0_8_,
                    CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                             (undefined2)local_378[0]._M_allocated_capacity) + 1);
  }
  poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_520._0_8_,local_520._8_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
    operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"default_root_node ",0x12);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Root Nodes : ",0x15);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Meshes : ",0x11);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Skeletons : ",0x14);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Animations : ",0x15);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Cameras : ",0x12);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Materials : ",0x14);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of UVTextures : ",0x15);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of TextureImages : ",0x18);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Buffers : ",0x12);
  poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"nodes {\n",8);
  pNVar30 = (scene->nodes).
            super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((scene->nodes).
      super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>._M_impl.
      super__Vector_impl_data._M_finish != pNVar30) {
    lVar35 = 0;
    uVar31 = 0;
    do {
      (anonymous_namespace)::DumpNode_abi_cxx11_
                ((string *)local_388,
                 (_anonymous_namespace_ *)
                 ((long)&(((Node *)(&pNVar30->local_matrix + -1))->prim_name)._M_dataplus._M_p +
                 lVar35),(Node *)0x1,(uint32_t)plVar23);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_388._0_8_,local_388._8_8_);
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      uVar31 = uVar31 + 1;
      pNVar30 = (scene->nodes).
                super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar35 = lVar35 + 0x1a8;
    } while (uVar31 < (ulong)(((long)(scene->nodes).
                                     super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar30 >> 3
                              ) * 0x21cfb2b78c13521d));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"meshes {\n",9);
  local_530 = scene;
  if ((scene->meshes).
      super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (scene->meshes).
      super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar35 = 0;
    uVar31 = 0;
    do {
      pRVar34 = local_530;
      uVar22 = (uint32_t)plVar23;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      poVar16 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
      (anonymous_namespace)::DumpMesh_abi_cxx11_
                ((string *)local_388,
                 (_anonymous_namespace_ *)
                 ((long)&(((pRVar34->meshes).
                           super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                           ._M_impl.super__Vector_impl_data._M_start)->prim_name)._M_dataplus._M_p +
                 lVar35),mesh,uVar22);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,(char *)local_388._0_8_,local_388._8_8_);
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      uVar31 = uVar31 + 1;
      plVar23 = (long *)0x8f9c18f9c18f9c19;
      lVar35 = lVar35 + 0x520;
    } while (uVar31 < (ulong)(((long)(local_530->meshes).
                                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->meshes).
                                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0x7063e7063e7063e7));
  }
  pRVar34 = local_530;
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"skeletons {\n",0xc);
  if ((pRVar34->skeletons).
      super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pRVar34->skeletons).
      super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar35 = 0;
    uVar31 = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_558 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_558,"] ",2);
      pSVar3 = (pRVar34->skeletons).
               super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x1,n);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"skeleton {\n",0xb);
      uVar22 = extraout_EDX;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_00;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"name ",5);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_520._0_8_ = local_520 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_520,*(ulong *)((long)&(pSVar3->prim_name)._M_dataplus._M_p + lVar35))
      ;
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_520,(ulong)local_578._M_dataplus._M_p);
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      uVar22 = extraout_EDX_01;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_04;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"abs_path ",9);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_520._0_8_ = local_520 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_520,*(ulong *)((long)&(pSVar3->abs_path)._M_dataplus._M_p + lVar35));
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_520,(ulong)local_578._M_dataplus._M_p);
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      uVar22 = extraout_EDX_05;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_06;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_07;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_08;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"anim_id ",8);
      poVar16 = (ostream *)
                ::std::ostream::operator<<(poVar16,*(int *)((long)&pSVar3->anim_id + lVar35));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      uVar22 = extraout_EDX_09;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_10;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"display_name ",0xd);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_520._0_8_ = local_520 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_520,
                 *(ulong *)((long)(pSVar3->root_node).bind_transform.m +
                           lVar35 + 0xffffffffffffff98U));
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_520,(ulong)local_578._M_dataplus._M_p);
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      anon_unknown_0::detail::DumpSkelNode
                ((stringstream *)local_388,
                 (SkelNode *)((long)(pSVar3->root_node).bind_transform.m + lVar35 + -0x48),2);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_388 + 0x10),"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x1,n_00);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"}\n",2);
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_558,local_550,local_548);
      if (local_550 != (char *)&local_540) {
        operator_delete(local_550,CONCAT62(uStack_53e,local_540) + 1);
      }
      uVar31 = uVar31 + 1;
      lVar35 = lVar35 + 0x1c8;
      pRVar34 = local_530;
    } while (uVar31 < (ulong)(((long)(local_530->skeletons).
                                     super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->skeletons).
                                     super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7dc11f7047dc11f7));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"animations {\n",0xd);
  if ((pRVar34->animations).
      super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pRVar34->animations).
      super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar16 = (ostream *)(local_388 + 0x10);
    local_390 = local_308;
    local_1f8 = a_Stack_4a0;
    uVar31 = 0;
    do {
      poVar21 = (ostream *)(local_388 + 0x10);
      paVar32 = &local_5b8.field_2;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_1f0 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1f0,"] ",2);
      pAVar17 = (pRVar34->animations).
                super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar31;
      local_1e8 = uVar31;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_520);
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x1,n_01);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"animation {\n",0xc);
      uVar22 = extraout_EDX_11;
      if ((ostream *)local_388._0_8_ != poVar21) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
        uVar22 = extraout_EDX_12;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"name ",5);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = poVar21;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_388,(ulong)(pAVar17->prim_name)._M_dataplus._M_p);
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((ostream *)local_388._0_8_ != poVar21) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_13;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_14;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_15;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_16;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"abs_path ",9);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = poVar21;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_388,(ulong)(pAVar17->abs_path)._M_dataplus._M_p);
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((ostream *)local_388._0_8_ != poVar21) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_17;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_18;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_19;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_20;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"display_name ",0xd);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = poVar21;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_388,(ulong)(pAVar17->display_name)._M_dataplus._M_p);
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((ostream *)local_388._0_8_ != poVar21) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar25 = extraout_RDX;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar25 = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar25 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar25 = extraout_RDX_02;
      }
      p_Var20 = *(_Base_ptr *)((long)&(pAVar17->channels_map)._M_t._M_impl + 0x18);
      auVar37._8_8_ = uVar25;
      auVar37._0_8_ = p_Var20;
      local_1e0 = (_Base_ptr)((long)&(pAVar17->channels_map)._M_t._M_impl + 8);
      if (p_Var20 != local_1e0) {
        do {
          p_Var26 = auVar37._0_8_;
          pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x2,auVar37._8_4_);
          poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_520 + 0x10),(char *)local_388._0_8_,local_388._8_8_
                              );
          poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18,*(char **)(p_Var26 + 1),(long)p_Var26[1]._M_parent);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar18," {\n",3);
          uVar25 = extraout_RDX_03;
          if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,
                            CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                     (undefined2)local_378[0]._M_allocated_capacity) + 1);
            uVar25 = extraout_RDX_04;
          }
          uVar22 = (uint32_t)uVar25;
          auVar36._8_8_ = uVar25;
          auVar36._0_8_ = p_Var26[2]._M_right;
          local_558 = (ostream *)&p_Var26[2]._M_parent;
          local_398 = p_Var26;
          if (p_Var26[2]._M_right != (_Base_ptr)local_558) {
            do {
              p_Var26 = auVar36._0_8_;
              _Var2 = p_Var26[1]._M_color;
              uVar22 = auVar36._8_4_;
              if (_Var2 == 3) {
                pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,uVar22);
                poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                                     local_5b8._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"scales ",7);
                (anonymous_namespace)::detail::PrintAnimationSamples<std::array<float,3ul>>
                          (&local_578,(detail *)&p_Var26[8]._M_left,samples_00);
                local_550 = (char *)&local_540;
                local_540 = 0x22;
                local_548 = 1;
                local_378[0]._M_allocated_capacity._0_2_ = 0x22;
                local_388._8_8_ = 1;
                local_388._0_8_ = (ostream *)(local_388 + 0x10);
                ::std::__cxx11::string::_M_append
                          ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
                puVar19 = (undefined8 *)
                          ::std::__cxx11::string::_M_append((char *)local_388,(ulong)local_550);
                local_598 = &local_588;
                plVar15 = puVar19 + 2;
                if ((long *)*puVar19 == plVar15) {
                  local_588 = *plVar15;
                  lStack_580 = puVar19[3];
                }
                else {
                  local_588 = *plVar15;
                  local_598 = (long *)*puVar19;
                }
                local_590 = puVar19[1];
                *puVar19 = plVar15;
                puVar19[1] = 0;
                *(undefined1 *)(puVar19 + 2) = 0;
                if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
LAB_003631fa:
                  operator_delete((void *)local_388._0_8_,
                                  CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                           (undefined2)local_378[0]._M_allocated_capacity) + 1);
                }
LAB_0036320a:
                poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18,(char *)local_598,local_590);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
                if (local_598 != &local_588) {
LAB_0036323f:
                  operator_delete(local_598,local_588 + 1);
                }
LAB_0036324c:
                if (local_550 != (char *)&local_540) {
                  operator_delete(local_550,CONCAT62(uStack_53e,local_540) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_578._M_dataplus._M_p != &local_578.field_2) {
                  operator_delete(local_578._M_dataplus._M_p,
                                  CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                           local_578.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                  operator_delete(local_5b8._M_dataplus._M_p,
                                  local_5b8.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                if (_Var2 == 2) {
                  pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,uVar22);
                  local_528 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                                         local_5b8._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_528,"rotations ",10);
                  ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"[",1);
                  if (p_Var26[7]._M_parent != *(_Base_ptr *)(p_Var26 + 7)) {
                    lVar35 = 4;
                    uVar31 = 0;
                    do {
                      if (uVar31 != 0) {
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
                      }
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
                      poVar18 = ::std::ostream::_M_insert<double>
                                          ((double)*(float *)(*(long *)(p_Var26 + 7) + -4 + lVar35))
                      ;
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
                      poVar18 = ::std::operator<<(poVar18,(float4 *)
                                                          (*(long *)(p_Var26 + 7) + lVar35));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,")",1);
                      uVar31 = uVar31 + 1;
                      lVar35 = lVar35 + 0x14;
                    } while (uVar31 < (ulong)(((long)p_Var26[7]._M_parent - *(long *)(p_Var26 + 7)
                                              >> 2) * -0x3333333333333333));
                  }
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"]",1);
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
                  ::std::ios_base::~ios_base((ios_base *)local_390);
                  local_550 = (char *)&local_540;
                  local_540 = 0x22;
                  local_548 = 1;
                  local_378[0]._M_allocated_capacity._0_2_ = 0x22;
                  local_388._8_8_ = 1;
                  local_388._0_8_ = poVar16;
                  ::std::__cxx11::string::_M_append
                            ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
                  puVar19 = (undefined8 *)
                            ::std::__cxx11::string::_M_append((char *)local_388,(ulong)local_550);
                  plVar15 = puVar19 + 2;
                  if ((long *)*puVar19 == plVar15) {
                    local_588 = *plVar15;
                    lStack_580 = puVar19[3];
                    local_598 = &local_588;
                  }
                  else {
                    local_588 = *plVar15;
                    local_598 = (long *)*puVar19;
                  }
                  local_590 = puVar19[1];
                  *puVar19 = plVar15;
                  puVar19[1] = 0;
                  *(undefined1 *)(puVar19 + 2) = 0;
                  if ((ostream *)local_388._0_8_ != poVar16) {
                    operator_delete((void *)local_388._0_8_,
                                    CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                             (undefined2)local_378[0]._M_allocated_capacity) + 1);
                  }
                  poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_528,(char *)local_598,local_590);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
                  if (local_598 != &local_588) goto LAB_0036323f;
                  goto LAB_0036324c;
                }
                if (_Var2 == _S_black) {
                  pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,uVar22);
                  poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                                       local_5b8._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"translations ",0xd);
                  (anonymous_namespace)::detail::PrintAnimationSamples<std::array<float,3ul>>
                            (&local_578,(detail *)&p_Var26[5]._M_parent,samples);
                  local_550 = (char *)&local_540;
                  local_540 = 0x22;
                  local_548 = 1;
                  local_378[0]._M_allocated_capacity._0_2_ = 0x22;
                  local_388._8_8_ = 1;
                  local_388._0_8_ = poVar16;
                  ::std::__cxx11::string::_M_append
                            ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
                  plVar23 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)local_388,(ulong)local_550);
                  local_598 = &local_588;
                  plVar15 = plVar23 + 2;
                  if ((long *)*plVar23 == plVar15) {
                    local_588 = *plVar15;
                    lStack_580 = plVar23[3];
                  }
                  else {
                    local_588 = *plVar15;
                    local_598 = (long *)*plVar23;
                  }
                  local_590 = plVar23[1];
                  *plVar23 = (long)plVar15;
                  plVar23[1] = 0;
                  *(undefined1 *)(plVar23 + 2) = 0;
                  if ((ostream *)local_388._0_8_ != poVar16) goto LAB_003631fa;
                  goto LAB_0036320a;
                }
              }
              auVar36 = ::std::_Rb_tree_increment(p_Var26);
              uVar22 = auVar36._8_4_;
            } while (auVar36._0_8_ != local_558);
          }
          pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x2,uVar22);
          poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_520 + 0x10),(char *)local_388._0_8_,local_388._8_8_
                              );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"}\n",2);
          if ((ostream *)local_388._0_8_ != poVar16) {
            operator_delete((void *)local_388._0_8_,
                            CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                     (undefined2)local_378[0]._M_allocated_capacity) + 1);
          }
          auVar37 = ::std::_Rb_tree_increment(local_398);
        } while (auVar37._0_8_ != local_1e0);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_520 + 0x10),"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x1,n_02);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"}\n",2);
      if ((ostream *)local_388._0_8_ != poVar16) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_520);
      ::std::ios_base::~ios_base((ios_base *)local_1f8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1f0,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      uVar31 = local_1e8 + 1;
      pRVar34 = local_530;
    } while (uVar31 < (ulong)(((long)(local_530->animations).
                                     super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->animations).
                                     super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6) *
                             -0x5555555555555555));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"cameras {\n",10);
  if ((pRVar34->cameras).
      super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pRVar34->cameras).
      super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar35 = 0;
    uVar31 = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_558 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_558,"] ",2);
      pRVar4 = (pRVar34->cameras).
               super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x1,n_03);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"camera {\n",9);
      uVar22 = extraout_EDX_21;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_22;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"name ",5);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_520._0_8_ = local_520 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_520,*(ulong *)((long)&(pRVar4->name)._M_dataplus._M_p + lVar35));
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_520,(ulong)local_578._M_dataplus._M_p);
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      uVar22 = extraout_EDX_23;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_24;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_25;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_26;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"abs_path ",9);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_520._0_8_ = local_520 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_520,*(ulong *)((long)&(pRVar4->abs_path)._M_dataplus._M_p + lVar35));
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_520,(ulong)local_578._M_dataplus._M_p);
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      uVar22 = extraout_EDX_27;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_28;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_29;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_30;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"display_name ",0xd);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_520._0_8_ = local_520 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_520,
                 *(ulong *)((long)&(pRVar4->display_name)._M_dataplus._M_p + lVar35));
      puVar19 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)local_520,(ulong)local_578._M_dataplus._M_p);
      plVar15 = puVar19 + 2;
      if ((long *)*puVar19 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = puVar19[3];
        local_598 = &local_588;
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*puVar19;
      }
      local_590 = puVar19[1];
      *puVar19 = plVar15;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      uVar22 = extraout_EDX_31;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_32;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_33;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_34;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"shutterOpen ",0xc);
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_5b8,vsnprintf,0x148,"%f",
                 (int)*(undefined8 *)((long)&pRVar4->shutterOpen + lVar35));
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      uVar22 = extraout_EDX_35;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_36;
      }
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_37;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"shutterClose ",0xd);
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_5b8,vsnprintf,0x148,"%f",
                 (int)*(undefined8 *)((long)&pRVar4->shutterClose + lVar35));
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_388 + 0x10),"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x1,n_04);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"}\n",2);
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_558,local_550,local_548);
      if (local_550 != (char *)&local_540) {
        operator_delete(local_550,CONCAT62(uStack_53e,local_540) + 1);
      }
      uVar31 = uVar31 + 1;
      lVar35 = lVar35 + 0x98;
      pRVar34 = local_530;
    } while (uVar31 < (ulong)(((long)(local_530->cameras).
                                     super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->cameras).
                                     super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x79435e50d79435e5));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"materials {\n",0xc);
  if ((pRVar34->materials).
      super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pRVar34->materials).
      super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar16 = (ostream *)(local_388 + 0x10);
    local_398 = local_308;
    local_390 = a_Stack_4a0;
    lVar35 = 0xcc;
    poVar18 = (ostream *)0x0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_558 = poVar18;
      local_528 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,"] ",2);
      pRVar5 = (pRVar34->materials).
               super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_520);
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x1,n_05);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"material {\n",0xb);
      uVar22 = extraout_EDX_38;
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
        uVar22 = extraout_EDX_39;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"name ",5);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = local_388 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append((char *)local_388,*(ulong *)((long)pRVar5 + lVar35 + -0xcc))
      ;
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_40;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_41;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_42;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_43;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"abs_path ",9);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = local_388 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append((char *)local_388,*(ulong *)((long)pRVar5 + lVar35 + -0xac))
      ;
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_44;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_45;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_46;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_47;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"display_name ",0xd);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = local_388 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append((char *)local_388,*(ulong *)((long)pRVar5 + lVar35 + -0x8c))
      ;
      plVar23 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar15 = plVar23 + 2;
      if ((long *)*plVar23 == plVar15) {
        local_588 = *plVar15;
        lStack_580 = plVar23[3];
      }
      else {
        local_588 = *plVar15;
        local_598 = (long *)*plVar23;
      }
      local_590 = plVar23[1];
      *plVar23 = (long)plVar15;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_48;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_49;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar22 = extraout_EDX_50;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_51;
      }
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"surfaceShader = ",0x10);
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"PreviewSurfaceShader {\n",0x17);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_06);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"useSpecularWorkflow = ",0x16);
      bVar1 = *(byte *)((long)pRVar5 + lVar35 + -0x6c);
      local_598 = &local_588;
      ::std::__cxx11::string::_M_construct((ulong)&local_598,'\x01');
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_598,1,(uint)bVar1);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_52;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar22 = extraout_EDX_53;
      }
      paVar32 = &local_5b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_54;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"diffuseColor = ",0xf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)pRVar5 + lVar35 + -0x5c) < 0) {
        ::std::operator<<(poVar16,(float3 *)((long)pRVar5 + lVar35 + -0x68));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<(poVar16,*(int *)((long)pRVar5 + lVar35 + -0x5c));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_07);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"metallic = ",0xb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)pRVar5 + lVar35 + -0x34) < 0) {
        ::std::ostream::_M_insert<double>((double)*(float *)((long)pRVar5 + lVar35 + -0x38));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<(poVar16,*(int *)((long)pRVar5 + lVar35 + -0x34));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_08);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"roughness = ",0xc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)pRVar5 + lVar35 + -0x2c) < 0) {
        ::std::ostream::_M_insert<double>((double)*(float *)((long)pRVar5 + lVar35 + -0x30));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<(poVar16,*(int *)((long)pRVar5 + lVar35 + -0x2c));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_09);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"ior = ",6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)&(pRVar5->surfaceShader).diffuseColor.value + lVar35 + 0xffffffffffffff98U)
          < 0) {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                     lVar35 + 0xffffffffffffff94U));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar16,*(int *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                             lVar35 + 0xffffffffffffff98U));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_10);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"clearcoat = ",0xc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)pRVar5 + lVar35 + -0x24) < 0) {
        ::std::ostream::_M_insert<double>((double)*(float *)((long)pRVar5 + lVar35 + -0x28));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<(poVar16,*(int *)((long)pRVar5 + lVar35 + -0x24));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_11);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"clearcoatRoughness = ",0x15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)(&(pRVar5->surfaceShader).diffuseColor + 0xfffffffffffffff8) + lVar35) < 0)
      {
        ::std::ostream::_M_insert<double>((double)*(float *)((long)pRVar5 + lVar35 + -0x20));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar16,*(int *)((long)(&(pRVar5->surfaceShader).diffuseColor +
                                                    0xfffffffffffffff8) + lVar35));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_12);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"opacity = ",10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)&(pRVar5->surfaceShader).diffuseColor.value + lVar35 + 0xffffffffffffff88U)
          < 0) {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                     lVar35 + 0xffffffffffffff84U));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar16,*(int *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                             lVar35 + 0xffffffffffffff88U));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_13);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"opacityThreshold = ",0x13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)(&(pRVar5->surfaceShader).diffuseColor + 0xfffffffffffffff9) + lVar35) < 0)
      {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                     lVar35 + 0xffffffffffffff8cU));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar16,*(int *)((long)(&(pRVar5->surfaceShader).diffuseColor +
                                                    0xfffffffffffffff9) + lVar35));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_14);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"normal = ",9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)&(pRVar5->surfaceShader).diffuseColor.value + lVar35 + 0xffffffffffffffa8U)
          < 0) {
        ::std::operator<<(poVar16,(float3 *)
                                  ((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                  lVar35 + 0xffffffffffffff9cU));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar16,*(int *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                             lVar35 + 0xffffffffffffffa8U));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_15);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"displacement = ",0xf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)(&(pRVar5->surfaceShader).diffuseColor + 0xfffffffffffffffb) + lVar35) < 0)
      {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                     lVar35 + 0xffffffffffffffacU));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar16,*(int *)((long)(&(pRVar5->surfaceShader).diffuseColor +
                                                    0xfffffffffffffffb) + lVar35));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_16);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"occlusion = ",0xc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)&(pRVar5->surfaceShader).diffuseColor.value + lVar35 + 0xffffffffffffffb8U)
          < 0) {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                     lVar35 + 0xffffffffffffffb4U));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"texture_id[",0xb);
        poVar18 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar16,*(int *)((long)&(pRVar5->surfaceShader).diffuseColor.value +
                                             lVar35 + 0xffffffffffffffb8U));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,n_17);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"}\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_398);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_520 + 0x10),local_578._M_dataplus._M_p,local_578._M_string_length
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_520 + 0x10),"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x1,n_18);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_520 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"}\n",2);
      if ((ostream *)local_388._0_8_ != poVar16) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_520);
      ::std::ios_base::~ios_base((ios_base *)local_390);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,local_550,local_548);
      if (local_550 != (char *)&local_540) {
        operator_delete(local_550,CONCAT62(uStack_53e,local_540) + 1);
      }
      poVar18 = local_558 + 1;
      lVar35 = lVar35 + 0x100;
      pRVar34 = local_530;
    } while (poVar18 < (ostream *)
                       ((long)(local_530->materials).
                              super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_530->materials).
                              super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 8));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"textures {\n",0xb);
  if ((pRVar34->textures).
      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pRVar34->textures).
      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar16 = (ostream *)0x0;
    do {
      poVar21 = (ostream *)(local_388 + 0x10);
      pcVar27 = local_520 + 0x10;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_528 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,"] ",2);
      pUVar6 = (pRVar34->textures).
               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_558 = poVar16;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"UVTexture {\n",0xc);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,n_19);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"primvar_name ",0xd);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,pUVar6[(long)poVar16].varname_uv._M_dataplus._M_p,
                           pUVar6[(long)poVar16].varname_uv._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_55;
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_56;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"connectedOutputChannel ",0x17);
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      local_520._0_8_ = pcVar27;
      switch(pUVar6[(long)poVar16].connectedOutputChannel) {
      case R:
        local_510[0]._0_2_ = 0x72;
        break;
      case G:
        local_510[0]._0_2_ = 0x67;
        break;
      case B:
        local_510[0]._0_2_ = 0x62;
        break;
      case A:
        local_510[0]._0_2_ = 0x61;
        break;
      case RGB:
        local_520._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3;
        local_510[0]._0_4_ = 0x626772;
        goto LAB_00364f2b;
      default:
        local_5b8._M_dataplus._M_p = (pointer)0x2d;
        local_520._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_520,(ulong)&local_5b8);
        local_520._8_8_ = local_5b8._M_dataplus._M_p;
        builtin_strncpy((char *)local_520._0_8_,"[[InternalError. Invalid UVTexture::Channel]]",0x2d
                       );
        *(char *)(local_520._0_8_ + (long)local_5b8._M_dataplus._M_p) = '\0';
        local_510[0]._0_8_ = local_520._8_8_;
        goto LAB_00364f2b;
      }
      local_520._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
LAB_00364f2b:
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_57;
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_58;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"authoredOutputChannels ",0x17);
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      p_Var20 = *(_Base_ptr *)
                 ((long)&pUVar6[(long)poVar16].authoredOutputChannels._M_t._M_impl + 0x18);
      uVar25 = local_510[0]._M_allocated_capacity;
      while (local_510[0]._0_8_ = uVar25,
            p_Var20 !=
            (_Base_ptr)((long)&pUVar6[(long)poVar16].authoredOutputChannels._M_t._M_impl + 8U)) {
        local_510[0]._M_allocated_capacity._2_6_ = (undefined6)((ulong)uVar25 >> 0x10);
        switch(p_Var20[1]._M_color) {
        case _S_red:
          local_510[0]._0_2_ = 0x72;
          break;
        case _S_black:
          local_510[0]._0_2_ = 0x67;
          break;
        case 2:
          local_510[0]._0_2_ = 0x62;
          break;
        case 3:
          local_510[0]._0_2_ = 0x61;
          break;
        case 4:
          local_520._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x3;
          local_510[0]._M_allocated_capacity._4_4_ = (undefined4)((ulong)uVar25 >> 0x20);
          local_510[0]._0_4_ = 0x626772;
          local_520._0_8_ = pcVar27;
          goto LAB_0036505e;
        default:
          local_5b8._M_dataplus._M_p = (pointer)0x2d;
          local_520._0_8_ = pcVar27;
          local_520._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_520,(ulong)&local_5b8);
          local_520._8_8_ = local_5b8._M_dataplus._M_p;
          builtin_strncpy((char *)local_520._0_8_,"[[InternalError. Invalid UVTexture::Channel]]",
                          0x2d);
          *(char *)(local_520._0_8_ + (long)local_5b8._M_dataplus._M_p) = '\0';
          local_510[0]._0_8_ = local_520._8_8_;
          goto LAB_0036505e;
        }
        local_520._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        local_520._0_8_ = pcVar27;
LAB_0036505e:
        poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar21,(char *)local_520._0_8_,local_520._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
        if ((char *)local_520._0_8_ != pcVar27) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        }
        p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
        uVar25 = local_510[0]._M_allocated_capacity;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,n_20);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"bias ",5);
      poVar18 = ::std::operator<<(poVar18,&pUVar6[(long)poVar16].bias);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_59;
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_60;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"scale ",6);
      poVar18 = ::std::operator<<(poVar18,&pUVar6[(long)poVar16].scale);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_61;
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_62;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"wrapS ",6);
      to_string_abi_cxx11_(&local_5b8,(tydra *)(ulong)pUVar6[(long)poVar16].wrapS,mode);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_63;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_64;
      }
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_65;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"wrapT ",6);
      to_string_abi_cxx11_(&local_5b8,(tydra *)(ulong)pUVar6[(long)poVar16].wrapT,mode_00);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_66;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_67;
      }
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_68;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"fallback_uv ",0xc);
      poVar18 = ::std::operator<<(poVar18,&pUVar6[(long)poVar16].fallback_uv);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_69;
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_70;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"textureImageID ",0xf);
      uVar31 = pUVar6[(long)poVar16].texture_image_id;
      uVar29 = -uVar31;
      if (0 < (long)uVar31) {
        uVar29 = uVar31;
      }
      uVar33 = 1;
      if (9 < uVar29) {
        uVar24 = uVar29;
        uVar10 = 4;
        do {
          uVar33 = uVar10;
          if (uVar24 < 100) {
            uVar33 = uVar33 - 2;
            goto LAB_0036551a;
          }
          if (uVar24 < 1000) {
            uVar33 = uVar33 - 1;
            goto LAB_0036551a;
          }
          if (uVar24 < 10000) goto LAB_0036551a;
          bVar9 = 99999 < uVar24;
          uVar24 = uVar24 / 10000;
          uVar10 = uVar33 + 4;
        } while (bVar9);
        uVar33 = uVar33 + 1;
      }
LAB_0036551a:
      paVar32 = &local_5b8.field_2;
      local_5b8._M_dataplus._M_p = (pointer)paVar32;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar33 - (char)((long)uVar31 >> 0x3f));
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_5b8._M_dataplus._M_p + -((long)uVar31 >> 0x3f),uVar33,uVar29);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_71;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_72;
      }
      pcVar27 = local_520 + 0x10;
      poVar18 = (ostream *)(local_388 + 0x10);
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_73;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"has UsdTransform2d ",0x13);
      bVar9 = pUVar6[(long)poVar16].has_transform2d;
      local_5b8._M_dataplus._M_p = (pointer)paVar32;
      ::std::__cxx11::string::_M_construct((ulong)&local_5b8,'\x01');
      ::std::__detail::__to_chars_10_impl<unsigned_int>(local_5b8._M_dataplus._M_p,1,(uint)bVar9);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
      uVar22 = extraout_EDX_74;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar32) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_75;
      }
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_76;
      }
      if (pUVar6[(long)poVar16].has_transform2d != false) {
        pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x3,uVar22);
        poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)local_520._0_8_,local_520._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"rotation ",9);
        poVar21 = ::std::ostream::_M_insert<double>((double)pUVar6[(long)poVar16].tx_rotation);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
        uVar22 = extraout_EDX_77;
        if ((char *)local_520._0_8_ != pcVar27) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
          uVar22 = extraout_EDX_78;
        }
        pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x3,uVar22);
        poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)local_520._0_8_,local_520._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"scale ",6);
        poVar21 = ::std::operator<<(poVar21,&pUVar6[(long)poVar16].tx_scale);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
        uVar22 = extraout_EDX_79;
        if ((char *)local_520._0_8_ != pcVar27) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
          uVar22 = extraout_EDX_80;
        }
        pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x3,uVar22);
        poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)local_520._0_8_,local_520._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"translation ",0xc);
        poVar21 = ::std::operator<<(poVar21,&pUVar6[(long)poVar16].tx_translation);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
        uVar22 = extraout_EDX_81;
        if ((char *)local_520._0_8_ != pcVar27) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
          uVar22 = extraout_EDX_82;
        }
        pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x3,uVar22);
        poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)local_520._0_8_,local_520._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"computed_transform ",0x13);
        poVar16 = ::std::operator<<(poVar21,&pUVar6[(long)poVar16].transform);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
        if ((char *)local_520._0_8_ != pcVar27) {
          operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x1,n_21);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"}\n",2);
      if ((char *)local_520._0_8_ != pcVar27) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,(char *)local_598,local_590);
      pRVar34 = local_530;
      poVar16 = local_558;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
      }
      poVar16 = poVar16 + 1;
    } while (poVar16 < (ostream *)
                       (((long)(pRVar34->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pRVar34->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d
                       ));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"images {\n",9);
  if ((pRVar34->images).
      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pRVar34->images).
      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar16 = (ostream *)0x0;
    do {
      poVar21 = (ostream *)(local_388 + 0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_528 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,"] ",2);
      pTVar7 = (pRVar34->images).
               super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_558 = poVar16;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"TextureImage {\n",0xf);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,n_22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"asset_identifier \"",0x12);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,pTVar7[(long)poVar16].asset_identifier._M_dataplus._M_p,
                           pTVar7[(long)poVar16].asset_identifier._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\"\n",2);
      uVar22 = extraout_EDX_83;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_84;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"channels ",9);
      uVar33 = pTVar7[(long)poVar16].channels;
      uVar10 = -uVar33;
      if (0 < (int)uVar33) {
        uVar10 = uVar33;
      }
      uVar28 = 1;
      if (9 < uVar10) {
        uVar31 = (ulong)uVar10;
        uVar12 = 4;
        do {
          uVar28 = uVar12;
          uVar14 = (uint)uVar31;
          if (uVar14 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_00365b98;
          }
          if (uVar14 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_00365b98;
          }
          if (uVar14 < 10000) goto LAB_00365b98;
          uVar31 = uVar31 / 10000;
          uVar12 = uVar28 + 4;
        } while (99999 < uVar14);
        uVar28 = uVar28 + 1;
      }
LAB_00365b98:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar28 - (char)((int)uVar33 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_5b8._M_dataplus._M_p + (uVar33 >> 0x1f),uVar28,uVar10);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_85;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_86;
      }
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_87;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"width ",6);
      uVar33 = pTVar7[(long)poVar16].width;
      uVar10 = -uVar33;
      if (0 < (int)uVar33) {
        uVar10 = uVar33;
      }
      uVar28 = 1;
      if (9 < uVar10) {
        uVar31 = (ulong)uVar10;
        uVar12 = 4;
        do {
          uVar28 = uVar12;
          uVar14 = (uint)uVar31;
          if (uVar14 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_00365cca;
          }
          if (uVar14 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_00365cca;
          }
          if (uVar14 < 10000) goto LAB_00365cca;
          uVar31 = uVar31 / 10000;
          uVar12 = uVar28 + 4;
        } while (99999 < uVar14);
        uVar28 = uVar28 + 1;
      }
LAB_00365cca:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar28 - (char)((int)uVar33 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_5b8._M_dataplus._M_p + (uVar33 >> 0x1f),uVar28,uVar10);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_89;
      }
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_90;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"height ",7);
      uVar33 = pTVar7[(long)poVar16].height;
      uVar10 = -uVar33;
      if (0 < (int)uVar33) {
        uVar10 = uVar33;
      }
      uVar28 = 1;
      if (9 < uVar10) {
        uVar31 = (ulong)uVar10;
        uVar12 = 4;
        do {
          uVar28 = uVar12;
          uVar14 = (uint)uVar31;
          if (uVar14 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_00365dfc;
          }
          if (uVar14 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_00365dfc;
          }
          if (uVar14 < 10000) goto LAB_00365dfc;
          uVar31 = uVar31 / 10000;
          uVar12 = uVar28 + 4;
        } while (99999 < uVar14);
        uVar28 = uVar28 + 1;
      }
LAB_00365dfc:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar28 - (char)((int)uVar33 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_5b8._M_dataplus._M_p + (uVar33 >> 0x1f),uVar28,uVar10);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_91;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_92;
      }
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_93;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"miplevel ",9);
      uVar33 = pTVar7[(long)poVar16].miplevel;
      uVar10 = -uVar33;
      if (0 < (int)uVar33) {
        uVar10 = uVar33;
      }
      uVar28 = 1;
      if (9 < uVar10) {
        uVar31 = (ulong)uVar10;
        uVar12 = 4;
        do {
          uVar28 = uVar12;
          uVar14 = (uint)uVar31;
          if (uVar14 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_00365f2e;
          }
          if (uVar14 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_00365f2e;
          }
          if (uVar14 < 10000) goto LAB_00365f2e;
          uVar31 = uVar31 / 10000;
          uVar12 = uVar28 + 4;
        } while (99999 < uVar14);
        uVar28 = uVar28 + 1;
      }
LAB_00365f2e:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar28 - (char)((int)uVar33 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_5b8._M_dataplus._M_p + (uVar33 >> 0x1f),uVar28,uVar10);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      uVar22 = extraout_EDX_94;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_95;
      }
      poVar18 = (ostream *)(local_388 + 0x10);
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_96;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"colorSpace ",0xb);
      to_string_abi_cxx11_(&local_5b8,(tydra *)(ulong)pTVar7[(long)poVar16].colorSpace,cty);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
      uVar22 = extraout_EDX_97;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar22 = extraout_EDX_98;
      }
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_99;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"bufferID ",9);
      uVar31 = pTVar7[(long)poVar16].buffer_id;
      uVar29 = -uVar31;
      if (0 < (long)uVar31) {
        uVar29 = uVar31;
      }
      uVar33 = 1;
      if (9 < uVar29) {
        uVar24 = uVar29;
        uVar10 = 4;
        do {
          uVar33 = uVar10;
          if (uVar24 < 100) {
            uVar33 = uVar33 - 2;
            goto LAB_0036611d;
          }
          if (uVar24 < 1000) {
            uVar33 = uVar33 - 1;
            goto LAB_0036611d;
          }
          if (uVar24 < 10000) goto LAB_0036611d;
          bVar9 = 99999 < uVar24;
          uVar24 = uVar24 / 10000;
          uVar10 = uVar33 + 4;
        } while (bVar9);
        uVar33 = uVar33 + 1;
      }
LAB_0036611d:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar33 - (char)((long)uVar31 >> 0x3f));
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_5b8._M_dataplus._M_p + -((long)uVar31 >> 0x3f),uVar33,uVar29);
      poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      pRVar34 = local_530;
      poVar16 = local_558;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x1,n_23);
      poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"}\n",2);
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,(char *)local_598,local_590);
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
      }
      poVar16 = poVar16 + 1;
    } while (poVar16 < (ostream *)
                       (((long)(pRVar34->images).
                               super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pRVar34->images).
                               super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333
                       ));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"buffers {\n",10);
  if ((pRVar34->buffers).
      super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pRVar34->buffers).
      super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar16 = (ostream *)(local_388 + 0x10);
    lVar35 = 0x10;
    uVar31 = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      poVar18 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
      pBVar8 = (pRVar34->buffers).
               super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Buffer {\n",9);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,n_24);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"bytes ",6);
      poVar21 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
      uVar22 = extraout_EDX_x00100;
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
        uVar22 = extraout_EDX_x00101;
      }
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x2,uVar22);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"componentType ",0xe);
      to_string_abi_cxx11_
                (&local_5b8,(tydra *)(ulong)*(uint *)((long)pBVar8 + lVar35 + -0x10),cty_00);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_520,(pprint *)0x1,n_25);
      poVar21 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)local_520._0_8_,local_520._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar21,"}\n",2);
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)local_598,local_590);
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
      }
      uVar31 = uVar31 + 1;
      lVar35 = lVar35 + 0x20;
      pRVar34 = local_530;
    } while (uVar31 < (ulong)((long)(local_530->buffers).
                                    super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_530->buffers).
                                    super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  psVar11 = local_200;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar11;
}

Assistant:

std::string DumpRenderScene(const RenderScene &scene,
                            const std::string &format) {
  std::stringstream ss;

  if (format == "json") {
    // TODO:
    // Currently kdl only.
    ss << "// `json` format is not supported yet. Use KDL format\n";
  }

  ss << "title " << quote(scene.usd_filename) << "\n";
  ss << "default_root_node " << scene.default_root_node << "\n";
  ss << "// # of Root Nodes : " << scene.nodes.size() << "\n";
  ss << "// # of Meshes : " << scene.meshes.size() << "\n";
  ss << "// # of Skeletons : " << scene.skeletons.size() << "\n";
  ss << "// # of Animations : " << scene.animations.size() << "\n";
  ss << "// # of Cameras : " << scene.cameras.size() << "\n";
  ss << "// # of Materials : " << scene.materials.size() << "\n";
  ss << "// # of UVTextures : " << scene.textures.size() << "\n";
  ss << "// # of TextureImages : " << scene.images.size() << "\n";
  ss << "// # of Buffers : " << scene.buffers.size() << "\n";

  ss << "\n";

  ss << "nodes {\n";
  for (size_t i = 0; i < scene.nodes.size(); i++) {
    ss << DumpNode(scene.nodes[i], 1);
  }
  ss << "}\n";

  ss << "meshes {\n";
  for (size_t i = 0; i < scene.meshes.size(); i++) {
    ss << "[" << i << "] " << DumpMesh(scene.meshes[i], 1);
  }
  ss << "}\n";

  ss << "skeletons {\n";
  for (size_t i = 0; i < scene.skeletons.size(); i++) {
    ss << "[" << i << "] " << DumpSkeleton(scene.skeletons[i], 1);
  }
  ss << "}\n";

  ss << "animations {\n";
  for (size_t i = 0; i < scene.animations.size(); i++) {
    ss << "[" << i << "] " << DumpAnimation(scene.animations[i], 1);
  }
  ss << "}\n";

  ss << "cameras {\n";
  for (size_t i = 0; i < scene.cameras.size(); i++) {
    ss << "[" << i << "] " << DumpCamera(scene.cameras[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "materials {\n";
  for (size_t i = 0; i < scene.materials.size(); i++) {
    ss << "[" << i << "] " << DumpMaterial(scene.materials[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "textures {\n";
  for (size_t i = 0; i < scene.textures.size(); i++) {
    ss << "[" << i << "] " << DumpUVTexture(scene.textures[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "images {\n";
  for (size_t i = 0; i < scene.images.size(); i++) {
    ss << "[" << i << "] " << DumpImage(scene.images[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "buffers {\n";
  for (size_t i = 0; i < scene.buffers.size(); i++) {
    ss << "[" << i << "] " << DumpBuffer(scene.buffers[i], 1);
  }
  ss << "}\n";

  // ss << "TODO: AnimationChannel, ...\n";

  return ss.str();
}